

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O3

ValueType * __thiscall
nanovdb::
RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
::getValueAndCache<nanovdb::ReadAccessor<float,0,1,2>>
          (RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
           *this,CoordType *ijk,ReadAccessor<float,_0,_1,_2> *acc)

{
  int iVar1;
  uint uVar2;
  Tile *pTVar3;
  RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
  *pRVar4;
  RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
  *pRVar5;
  
  pTVar3 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
           ::findTile((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                       *)this,ijk);
  if (pTVar3 == (Tile *)0x0) {
    pRVar4 = (RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
              *)0x0;
  }
  else {
    iVar1 = pTVar3->childID;
    if ((long)iVar1 < 0) {
      pRVar4 = (RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
                *)&pTVar3->value;
    }
    else {
      uVar2 = *(uint *)(this + 0x20);
      (acc->mKey).mVec[2] = ijk->mVec[2];
      *(undefined8 *)(acc->mKey).mVec = *(undefined8 *)ijk->mVec;
      acc->mNode[2] =
           (InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
            *)(this + (long)iVar1 * 0x22040 + 0x40 + (ulong)uVar2 * 0x20);
      pRVar4 = (RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
                *)InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
                  ::getValueAndCache<nanovdb::ReadAccessor<float,0,1,2>>
                            ((InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
                              *)(this + (long)iVar1 * 0x22040 + 0x40 + (ulong)uVar2 * 0x20),ijk,acc)
      ;
    }
  }
  pRVar5 = this + 0x24;
  if (pTVar3 != (Tile *)0x0) {
    pRVar5 = pRVar4;
  }
  return (ValueType *)pRVar5;
}

Assistant:

__hostdev__ const ValueType& getValueAndCache(const CoordType& ijk, const AccT& acc) const
    {
        if (const Tile* tile = this->findTile(ijk)) {
            if (tile->childID < 0)
                return tile->value;
            const ChildT& child = this->child(*tile);
            acc.insert(ijk, &child);
            return child.getValueAndCache(ijk, acc);
        }
        return DataType::mBackground;
    }